

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

void __thiscall
so_5::timers_details::
actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
::release(actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
          *this)

{
  basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
  *this_00;
  timer_object_holder<timertt::thread_safety::unsafe> local_18;
  actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *local_10;
  actual_timer_t<timertt::timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_local;
  
  if (this->m_thread !=
      (timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
       *)0x0) {
    this_00 = (basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
               *)this->m_thread;
    local_10 = this;
    timertt::timer_object_holder<timertt::thread_safety::unsafe>::timer_object_holder
              (&local_18,&this->m_timer);
    timertt::details::
    basic_methods_impl_mixin<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_timertt::details::consumer_type::manager>
    ::deactivate(this_00,&local_18);
    timertt::timer_object_holder<timertt::thread_safety::unsafe>::~timer_object_holder(&local_18);
    this->m_thread =
         (timer_list_manager_template<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
          *)0x0;
    timertt::timer_object_holder<timertt::thread_safety::unsafe>::reset(&this->m_timer);
  }
  return;
}

Assistant:

virtual void
		release() override
			{
				if( m_thread )
				{
					m_thread->deactivate( m_timer );
					m_thread = nullptr;
					m_timer.reset();
				}
			}